

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aom_integer.c
# Opt level: O3

int aom_uleb_encode_fixed_size
              (uint64_t value,size_t available,size_t pad_to_size,uint8_t *coded_value,
              size_t *coded_size)

{
  byte bVar1;
  ulong uVar2;
  
  if ((((coded_size != (size_t *)0x0 && coded_value != (uint8_t *)0x0) && value >> 0x20 == 0) &&
      (pad_to_size < 9 && pad_to_size <= available)) &&
     (value >> ((char)pad_to_size * '\a' & 0x3fU) == 0)) {
    if (pad_to_size != 0) {
      uVar2 = 0;
      do {
        bVar1 = (byte)value;
        value = value >> 7;
        coded_value[uVar2] = (uVar2 < pad_to_size - 1) << 7 | bVar1 & 0x7f;
        uVar2 = uVar2 + 1;
      } while (pad_to_size != uVar2);
    }
    *coded_size = pad_to_size;
    return 0;
  }
  return -1;
}

Assistant:

int aom_uleb_encode_fixed_size(uint64_t value, size_t available,
                               size_t pad_to_size, uint8_t *coded_value,
                               size_t *coded_size) {
  if (value > kMaximumLeb128Value || !coded_value || !coded_size ||
      available < pad_to_size || pad_to_size > kMaximumLeb128Size) {
    return -1;
  }
  const uint64_t limit = 1ULL << (7 * pad_to_size);
  if (value >= limit) {
    // Can't encode 'value' within 'pad_to_size' bytes
    return -1;
  }

  for (size_t i = 0; i < pad_to_size; ++i) {
    uint8_t byte = value & 0x7f;
    value >>= 7;

    if (i < pad_to_size - 1) byte |= 0x80;  // Signal that more bytes follow.

    *(coded_value + i) = byte;
  }

  assert(value == 0);

  *coded_size = pad_to_size;
  return 0;
}